

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

size_t mbedtls_internal_sha256_process_many
                 (mbedtls_sha256_context_conflict *ctx,uint8_t *data,size_t len)

{
  int iVar1;
  size_t local_30;
  size_t processed;
  size_t len_local;
  uint8_t *data_local;
  mbedtls_sha256_context_conflict *ctx_local;
  
  local_30 = 0;
  processed = len;
  len_local = (size_t)data;
  while( true ) {
    if (processed < 0x40) {
      return local_30;
    }
    iVar1 = mbedtls_internal_sha256_process(ctx,(uchar *)len_local);
    if (iVar1 != 0) break;
    len_local = len_local + 0x40;
    processed = processed - 0x40;
    local_30 = local_30 + 0x40;
  }
  return 0;
}

Assistant:

static size_t mbedtls_internal_sha256_process_many_c(
    mbedtls_sha256_context *ctx, const uint8_t *data, size_t len)
{
    size_t processed = 0;

    while (len >= SHA256_BLOCK_SIZE) {
        if (mbedtls_internal_sha256_process_c(ctx, data) != 0) {
            return 0;
        }

        data += SHA256_BLOCK_SIZE;
        len  -= SHA256_BLOCK_SIZE;

        processed += SHA256_BLOCK_SIZE;
    }

    return processed;
}